

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O1

int Abc_CommandNChooseK(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__s;
  int iVar1;
  undefined8 in_RAX;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAig;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  int parameterizedCombK;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pAVar2 = Abc_FrameReadNtk(pAbc);
  if (argc != 1) {
    Extra_UtilGetoptReset();
    do {
      iVar1 = Extra_UtilGetopt(argc,argv,"cmCgh");
      if (0x2a < iVar1 - 0x43U) break;
    } while ((0x41100000001U >> ((ulong)(iVar1 - 0x43U) & 0x3f) & 1) != 0);
    if (iVar1 != -1) {
      fwrite("usage: nck [-cmgCh]\n",0x14,1,_stdout);
      fwrite("\tgenerates combinatorial signals for stabilization\n",0x33,1,_stdout);
      fwrite("\t-h : print usage\n",0x12,1,_stdout);
      return 1;
    }
  }
  pNtk = pAVar2;
  if (pAVar2->ntkType != ABC_NTK_STRASH) {
    puts("The input network was not strashed, strashing....");
    pNtk = Abc_NtkStrash(pAVar2,0,0,0);
  }
  pAig = Abc_NtkToDar(pNtk,0,1);
  printf("Enter parameterizedCombK = ");
  iVar1 = __isoc99_scanf("%d",(long)&uStack_38 + 4);
  if (iVar1 == 1) {
    putchar(10);
    p = generateGeneralDisjunctiveTester(pAVar2,pAig,uStack_38._4_4_);
    Aig_ManPrintStats(p);
    pAVar2 = Abc_NtkFromAigPhase(p);
    __s = p->pName;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(__s);
      __dest = (char *)malloc(sVar3 + 1);
      strcpy(__dest,__s);
    }
    pAVar2->pName = __dest;
    iVar1 = Abc_NtkCheck(pAVar2);
    if (iVar1 == 0) {
      fwrite("Abc_NtkCreateCone(): Network check has failed.\n",0x2f,1,_stdout);
    }
    Abc_FrameSetCurrentNetwork(pAbc,pAVar2);
    Aig_ManStop(p);
    Aig_ManStop(pAig);
    return 1;
  }
  puts("\nFailed to read integer!");
  return 0;
}

Assistant:

int Abc_CommandNChooseK( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp, *pNtkCombStabil;
    Aig_Man_t * pAig, *pAigCombStabil;
    int directive = -1;
    int c;
    int parameterizedCombK;

    pNtk = Abc_FrameReadNtk(pAbc);


    /*************************************************
    Extraction of Command Line Argument    
    *************************************************/
    if( argc == 1 )
    {
        assert( directive == -1 );
        directive = SIMPLE_kCS;
    }
    else
    {
        Extra_UtilGetoptReset();
        while ( ( c = Extra_UtilGetopt( argc, argv, "cmCgh" ) ) != EOF )
        {
            switch( c )
            {
            case 'c':
                directive = kCS_WITH_SAFETY_INVARIANTS; 
                break;
            case 'm':
                directive = kCS_WITH_DISCOVER_MONOTONE_SIGNALS; 
                break;
            case 'C':
                directive = kCS_WITH_SAFETY_AND_DCS_INVARIANTS;
                break;
            case 'g':
                directive = kCS_WITH_SAFETY_AND_USER_GIVEN_DCS_INVARIANTS;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
            }
        }
    }
    /*************************************************
    Extraction of Command Line Argument Ends    
    *************************************************/

    if( !Abc_NtkIsStrash( pNtk ) )
    {
        printf("The input network was not strashed, strashing....\n");
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );
        pAig = Abc_NtkToDar( pNtkTemp, 0, 1 );
    }
    else
    {
        pAig = Abc_NtkToDar( pNtk, 0, 1 );
        pNtkTemp = pNtk;
    }

/**********************Code for generation of nCk outputs**/
    //combCount = countCombination(1000, 3);
    //pAigCombStabil = generateDisjunctiveTester( pNtk, pAig, 7, 2 );
    printf("Enter parameterizedCombK = " );
    if( scanf("%d", &parameterizedCombK) != 1 )
    {
        printf("\nFailed to read integer!\n");
        return 0;
    }
    printf("\n");

    pAigCombStabil = generateGeneralDisjunctiveTester( pNtk, pAig, parameterizedCombK );
    Aig_ManPrintStats(pAigCombStabil);
    pNtkCombStabil = Abc_NtkFromAigPhase( pAigCombStabil );
    pNtkCombStabil->pName = Abc_UtilStrsav( pAigCombStabil->pName );
    if ( !Abc_NtkCheck( pNtkCombStabil ) )
            fprintf( stdout, "Abc_NtkCreateCone(): Network check has failed.\n" );
    Abc_FrameSetCurrentNetwork( pAbc, pNtkCombStabil );

    Aig_ManStop( pAigCombStabil );
    Aig_ManStop( pAig );

    return 1;
    //printf("\ncombCount = %d\n", combCount);
    //exit(0);
/**********************************************************/

    usage:
        fprintf( stdout, "usage: nck [-cmgCh]\n" );
            fprintf( stdout, "\tgenerates combinatorial signals for stabilization\n" );
        fprintf( stdout, "\t-h : print usage\n");
            return 1;

}